

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_export.cpp
# Opt level: O2

void __thiscall duckdb::CombineState::CombineState(CombineState *this,idx_t state_size_p)

{
  Allocator *allocator;
  Value local_70;
  
  (this->super_FunctionLocalState)._vptr_FunctionLocalState =
       (_func_int **)&PTR__CombineState_027b1f08;
  this->state_size = state_size_p;
  make_unsafe_uniq_array<unsigned_char>((duckdb *)&this->state_buffer0,state_size_p);
  make_unsafe_uniq_array<unsigned_char>((duckdb *)&this->state_buffer1,state_size_p);
  Value::POINTER(&local_70,
                 (uintptr_t)
                 (this->state_buffer0).
                 super_unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>._M_t.
                 super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                 super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl);
  Vector::Vector(&this->state_vector0,&local_70);
  Value::~Value(&local_70);
  Value::POINTER(&local_70,
                 (uintptr_t)
                 (this->state_buffer1).
                 super_unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>._M_t.
                 super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                 super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl);
  Vector::Vector(&this->state_vector1,&local_70);
  Value::~Value(&local_70);
  allocator = Allocator::DefaultAllocator();
  ArenaAllocator::ArenaAllocator(&this->allocator,allocator,0x800);
  return;
}

Assistant:

explicit CombineState(idx_t state_size_p)
	    : state_size(state_size_p), state_buffer0(make_unsafe_uniq_array<data_t>(state_size_p)),
	      state_buffer1(make_unsafe_uniq_array<data_t>(state_size_p)),
	      state_vector0(Value::POINTER(CastPointerToValue(state_buffer0.get()))),
	      state_vector1(Value::POINTER(CastPointerToValue(state_buffer1.get()))),
	      allocator(Allocator::DefaultAllocator()) {
	}